

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O0

void __thiscall icu_63::TimeZoneTransition::~TimeZoneTransition(TimeZoneTransition *this)

{
  TimeZoneTransition *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__TimeZoneTransition_004eef60;
  if ((this->fFrom != (TimeZoneRule *)0x0) && (this->fFrom != (TimeZoneRule *)0x0)) {
    (*(this->fFrom->super_UObject)._vptr_UObject[1])();
  }
  if ((this->fTo != (TimeZoneRule *)0x0) && (this->fTo != (TimeZoneRule *)0x0)) {
    (*(this->fTo->super_UObject)._vptr_UObject[1])();
  }
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

TimeZoneTransition::~TimeZoneTransition() {
    if (fFrom != NULL) {
        delete fFrom;
    }
    if (fTo != NULL) {
        delete fTo;
    }
}